

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O3

void __thiscall
HighsSymmetryDetection::markCellForRefinement(HighsSymmetryDetection *this,HighsInt cell)

{
  ulong uVar1;
  int iVar2;
  pointer puVar3;
  iterator __position;
  pointer piVar4;
  ulong uVar5;
  int *piVar6;
  long lVar7;
  ulong uVar8;
  int local_14;
  
  if (((this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[cell] - cell != 1) &&
     (puVar3 = (this->cellInRefinementQueue).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start, puVar3[cell] == '\0')) {
    puVar3[cell] = '\x01';
    __position._M_current =
         (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->refinementQueue,__position,&local_14);
      piVar6 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    else {
      *__position._M_current = cell;
      piVar6 = __position._M_current + 1;
      (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar6;
    }
    piVar4 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = piVar6[-1];
    lVar7 = (long)piVar6 - (long)piVar4 >> 2;
    uVar5 = lVar7 - 1;
    if (1 < lVar7) {
      do {
        uVar1 = uVar5 - 1;
        uVar8 = uVar1 >> 1;
        if (piVar4[uVar8] <= iVar2) goto LAB_002f9a41;
        piVar4[uVar5] = piVar4[uVar8];
        uVar5 = uVar8;
      } while (1 < uVar1);
      uVar5 = 0;
    }
LAB_002f9a41:
    piVar4[uVar5] = iVar2;
  }
  return;
}

Assistant:

void HighsSymmetryDetection::markCellForRefinement(HighsInt cell) {
  if (cellSize(cell) == 1 || cellInRefinementQueue[cell]) return;

  cellInRefinementQueue[cell] = true;
  refinementQueue.push_back(cell);
  std::push_heap(refinementQueue.begin(), refinementQueue.end(),
                 std::greater<HighsInt>());
}